

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start)

{
  int iVar1;
  type_conflict5 tVar2;
  int iVar3;
  int in_ECX;
  Breakpoint *in_RDX;
  int in_ESI;
  Breakpoint tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  Breakpoint *in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe70;
  uint uVar4;
  undefined4 in_stack_fffffffffffffe74;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe78;
  Breakpoint *in_stack_fffffffffffffe88;
  Breakpoint *in_stack_fffffffffffffe90;
  BreakpointCompare *in_stack_fffffffffffffe98;
  int local_30;
  int local_2c;
  int local_20;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::BreakpointCompare>
            ::incs[local_20];
    iVar3 = iVar1 + in_ECX;
    for (local_2c = iVar3; local_2c <= in_ESI; local_2c = local_2c + 1) {
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint
                ((Breakpoint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      local_30 = local_2c;
      while( true ) {
        uVar4 = in_stack_fffffffffffffe70 & 0xffffff;
        if (iVar3 <= local_30) {
          in_stack_fffffffffffffe68 = in_RDX;
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::Breakpoint
                    ((Breakpoint *)
                     (CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70) &
                     0xffffffff00ffffff),in_RDX);
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::Breakpoint
                    ((Breakpoint *)CONCAT44(in_stack_fffffffffffffe74,uVar4),
                     in_stack_fffffffffffffe68);
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::BreakpointCompare::operator()
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          in_stack_fffffffffffffe74 = 0;
          tVar2 = boost::multiprecision::operator<(in_stack_fffffffffffffe78,(int *)(ulong)uVar4);
          uVar4 = CONCAT13(tVar2,(int3)uVar4);
        }
        in_stack_fffffffffffffe70 = uVar4;
        if ((char)(in_stack_fffffffffffffe70 >> 0x18) == '\0') break;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::operator=
                  ((Breakpoint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe68);
        local_30 = local_30 - iVar1;
      }
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=
                ((Breakpoint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}